

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool BlockHasOwnScope(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5b,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (pnodeBlock->scope != (Scope *)0x0) {
    if (((pnodeBlock->super_ParseNodeStmt).super_ParseNode.grfpn & 0x200) == 0) {
      return true;
    }
    if ((pnodeBlock->field_0x5c & 3) == 0) {
      return (bool)(byteCodeGenerator->parentScopeInfo == (ScopeInfo *)0x0 &
                   *(byte *)((long)&byteCodeGenerator->flags + 1) >> 3);
    }
  }
  return false;
}

Assistant:

bool BlockHasOwnScope(ParseNodeBlock* pnodeBlock, ByteCodeGenerator *byteCodeGenerator)
{
    Assert(pnodeBlock->nop == knopBlock);
    return pnodeBlock->scope != nullptr &&
        (!(pnodeBlock->grfpn & fpnSyntheticNode) ||
            (pnodeBlock->blockType == PnodeBlockType::Global && byteCodeGenerator->IsEvalWithNoParentScopeInfo()));
}